

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAddBuffs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  uint fReverse;
  char *pcVar5;
  uint fDirect;
  uint local_48;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fDirect = 0;
  Extra_UtilGetoptReset();
  local_48 = 1000;
  fReverse = 0;
  fVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"Idrvh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 < 100) break;
      if (iVar1 == 100) {
        fDirect = fDirect ^ 1;
      }
      else {
        if (iVar1 != 0x72) goto LAB_002528ee;
        fReverse = fReverse ^ 1;
      }
    }
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Empty network.\n";
      }
      else if (pAVar2->ntkType == ABC_NTK_LOGIC) {
        pAVar2 = Abc_NtkAddBuffs(pAVar2,fDirect,fReverse,local_48,fVerbose);
        if (pAVar2 != (Abc_Ntk_t *)0x0) {
          Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
          return 0;
        }
        pcVar3 = "The command has failed.\n";
      }
      else {
        pcVar3 = "This command can only be applied to a logic network.\n";
      }
      iVar4 = -1;
      goto LAB_0025299c;
    }
    if (iVar1 != 0x49) goto LAB_002528ee;
    if (argc <= globalUtilOptind) break;
    local_48 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)local_48 < 0) {
LAB_002528ee:
      Abc_Print(-2,"usage: addbuffs [-I num] [-drvh]\n");
      Abc_Print(-2,"\t           adds buffers to create balanced CI/CO paths\n");
      Abc_Print(-2,"\t-I <num> : the number of refinement iterations [default = %d]\n",
                (ulong)local_48);
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (fDirect == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle using only CI-to-CO levelized order [default = %s]\n",pcVar3
               );
      pcVar3 = "yes";
      if (fReverse == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-r       : toggle using only CO-to-C1 levelized order [default = %s]\n",pcVar3
               );
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar5);
      pcVar3 = "\t-h       : print the command usage\n";
      iVar4 = -2;
LAB_0025299c:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-I\" should be followed by a positive integer.\n");
  goto LAB_002528ee;
}

Assistant:

int Abc_CommandAddBuffs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkAddBuffs( Abc_Ntk_t * pNtk, int fDirect, int fReverse, int nImprove, int fVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Ntk_t * pNtkRes;
    int fDirect;
    int fReverse;
    int nImprove;
    int c, fVerbose;

    fDirect  = 0;
    fReverse = 0;
    nImprove = 1000;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Idrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nImprove = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nImprove < 0 )
                goto usage;
            break;
        case 'd':
            fDirect ^= 1;
            break;
        case 'r':
            fReverse ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }

    // modify the current network
    pNtkRes = Abc_NtkAddBuffs( pNtk, fDirect, fReverse, nImprove, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: addbuffs [-I num] [-drvh]\n" );
    Abc_Print( -2, "\t           adds buffers to create balanced CI/CO paths\n" );
    Abc_Print( -2, "\t-I <num> : the number of refinement iterations [default = %d]\n", nImprove );
    Abc_Print( -2, "\t-d       : toggle using only CI-to-CO levelized order [default = %s]\n", fDirect? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle using only CO-to-C1 levelized order [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}